

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.capnp.h
# Opt level: O2

void __thiscall capnp::schema::Value::Builder::adoptData(Builder *this,Orphan<capnp::Data> *value)

{
  PointerBuilder local_18;
  
  *(undefined2 *)(this->_builder).data = 0xd;
  local_18.pointer = (this->_builder).pointers;
  local_18.segment = (this->_builder).segment;
  local_18.capTable = (this->_builder).capTable;
  capnp::_::PointerBuilder::adopt(&local_18,&value->builder);
  return;
}

Assistant:

inline void Value::Builder::adoptData(
    ::capnp::Orphan< ::capnp::Data>&& value) {
  _builder.setDataField<Value::Which>(
      ::capnp::bounded<0>() * ::capnp::ELEMENTS, Value::DATA);
  ::capnp::_::PointerHelpers< ::capnp::Data>::adopt(_builder.getPointerField(
      ::capnp::bounded<0>() * ::capnp::POINTERS), kj::mv(value));
}